

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int reduce_f5_up(vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  uint uVar1;
  int *piVar2;
  vrna_ud_t *pvVar3;
  code *pcVar4;
  uchar uVar5;
  int iVar6;
  int iVar7;
  int local_60;
  undefined1 *sc_red_ext;
  vrna_ud_t *domains_up;
  int *f5;
  int en;
  int e;
  int k;
  int u;
  sc_wrapper_f5 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int j_local;
  vrna_fold_compound_t *fc_local;
  
  piVar2 = (fc->matrices->field_2).field_0.f5;
  pvVar3 = fc->domains_up;
  f5._4_4_ = 10000000;
  pcVar4 = (code *)sc_wrapper->red_ext;
  if (((piVar2[j + -1] != 10000000) &&
      (uVar5 = (*evaluate)(1,j,1,j + -1,'\f',hc_dat_local), uVar5 != '\0')) &&
     (f5._4_4_ = piVar2[j + -1], pcVar4 != (code *)0x0)) {
    iVar6 = (*pcVar4)(j,1,j + -1,sc_wrapper);
    f5._4_4_ = iVar6 + f5._4_4_;
  }
  if ((pvVar3 != (vrna_ud_t *)0x0) && (pvVar3->energy_cb != (vrna_callback_ud_energy *)0x0)) {
    for (en = 0; en < pvVar3->uniq_motif_count; en = en + 1) {
      uVar1 = pvVar3->uniq_motif_size[en];
      if (((-1 < (int)(j - uVar1)) && (piVar2[(int)(j - uVar1)] != 10000000)) &&
         (uVar5 = (*evaluate)(1,j,1,j - uVar1,'\f',hc_dat_local), uVar5 != '\0')) {
        iVar6 = piVar2[(int)(j - uVar1)];
        iVar7 = (*pvVar3->energy_cb)(fc,(j - uVar1) + 1,j,0x11,pvVar3->data);
        f5._0_4_ = iVar6 + iVar7;
        if (pcVar4 != (code *)0x0) {
          iVar6 = (*pcVar4)(j,1,j - uVar1,sc_wrapper);
          f5._0_4_ = iVar6 + (int)f5;
        }
        if (f5._4_4_ < (int)f5) {
          local_60 = f5._4_4_;
        }
        else {
          local_60 = (int)f5;
        }
        f5._4_4_ = local_60;
      }
    }
  }
  return f5._4_4_;
}

Assistant:

int
reduce_f5_up(vrna_fold_compound_t       *fc,
             int                        j,
             vrna_callback_hc_evaluate  *evaluate,
             struct default_data        *hc_dat_local,
             struct sc_wrapper_f5       *sc_wrapper)
{
  int                 u, k, e, en, *f5;
  vrna_ud_t           *domains_up;
  sc_f5_reduce_to_ext *sc_red_ext;

  f5          = fc->matrices->f5;
  domains_up  = fc->domains_up;
  e           = INF;

  sc_red_ext = sc_wrapper->red_ext;

  /* check for 3' extension with one unpaired nucleotide */
  if (f5[j - 1] != INF) {
    if (evaluate(1, j, 1, j - 1, VRNA_DECOMP_EXT_EXT, hc_dat_local)) {
      e = f5[j - 1];

      if (sc_red_ext)
        e += sc_red_ext(j, 1, j - 1, sc_wrapper);
    }
  }

  if ((domains_up) && (domains_up->energy_cb)) {
    for (k = 0; k < domains_up->uniq_motif_count; k++) {
      u = domains_up->uniq_motif_size[k];
      if ((j - u >= 0) && (f5[j - u] != INF)) {
        if (evaluate(1, j, 1, j - u, VRNA_DECOMP_EXT_EXT, hc_dat_local)) {
          en = f5[j - u] +
               domains_up->energy_cb(fc,
                                     j - u + 1,
                                     j,
                                     VRNA_UNSTRUCTURED_DOMAIN_EXT_LOOP | VRNA_UNSTRUCTURED_DOMAIN_MOTIF,
                                     domains_up->data);

          if (sc_red_ext)
            en += sc_red_ext(j, 1, j - u, sc_wrapper);

          e = MIN2(e, en);
        }
      }
    }
  }

  return e;
}